

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGla.c
# Opt level: O0

void Ga2_ManComputeTest(Gia_Man_t *p)

{
  int iVar1;
  abctime aVar2;
  abctime aVar3;
  bool bVar4;
  uint local_28;
  int local_24;
  int Counter;
  int i;
  Gia_Obj_t *pObj;
  abctime clk;
  Gia_Man_t *p_local;
  
  local_28 = 0;
  aVar2 = Abc_Clock();
  Ga2_ManMarkup(p,5,0);
  aVar3 = Abc_Clock();
  Abc_PrintTime(1,"Time",aVar3 - aVar2);
  local_24 = 0;
  while( true ) {
    bVar4 = false;
    if (local_24 < p->nObjs) {
      _Counter = Gia_ManObj(p,local_24);
      bVar4 = _Counter != (Gia_Obj_t *)0x0;
    }
    if (!bVar4) break;
    iVar1 = Gia_ObjIsAnd(_Counter);
    if ((iVar1 != 0) && (*(long *)_Counter < 0)) {
      local_28 = local_28 + 1;
    }
    local_24 = local_24 + 1;
  }
  Abc_Print(1,"Marked AND nodes = %6d.  ",(ulong)local_28);
  aVar3 = Abc_Clock();
  Abc_PrintTime(1,"Time",aVar3 - aVar2);
  return;
}

Assistant:

void Ga2_ManComputeTest( Gia_Man_t * p )
{
    abctime clk;
//    unsigned uTruth;
    Gia_Obj_t * pObj;
    int i, Counter = 0;
    clk = Abc_Clock();
    Ga2_ManMarkup( p, 5, 0 );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    Gia_ManForEachAnd( p, pObj, i )
    {
        if ( !pObj->fPhase )
            continue;
//        uTruth = Ga2_ObjTruth( p, pObj );
//        printf( "%6d : ", Counter );
//        Kit_DsdPrintFromTruth( &uTruth, Ga2_ObjLeaveNum(p, pObj) ); 
//        printf( "\n" );
        Counter++;
    }
    Abc_Print( 1, "Marked AND nodes = %6d.  ", Counter );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
}